

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

HookAction spy_param_test::fooHookEnter(void *targetFunc,void *callbackParam,size_t frameBase)

{
  printf("+foo(func: %p, param: %p):\n",targetFunc,callbackParam);
  printf("  (%d, %f, %d, %f, %d, %f, %d, %f, %d, %f, %d, %f, %d, %f, %d, %f, %d, %f)\n",
         *(undefined8 *)(frameBase - 0x80),*(undefined8 *)(frameBase - 0x70),
         *(undefined8 *)(frameBase - 0x60),*(undefined8 *)(frameBase - 0x50),
         *(undefined8 *)(frameBase - 0x40),*(undefined8 *)(frameBase - 0x30),
         *(undefined8 *)(frameBase - 0x20),*(undefined8 *)(frameBase - 0x10),
         (ulong)*(uint *)(frameBase - 0xb0),(ulong)*(uint *)(frameBase - 0xa8),
         (ulong)*(uint *)(frameBase - 0xa0),(ulong)*(uint *)(frameBase - 0x98),
         (ulong)*(uint *)(frameBase - 0x90),*(undefined4 *)(frameBase - 0x88),
         *(undefined4 *)(frameBase + 0x10),*(undefined4 *)(frameBase + 0x18),
         *(undefined4 *)(frameBase + 0x20),*(undefined8 *)(frameBase + 0x28));
  return HookAction_Default;
}

Assistant:

spy::HookAction
fooHookEnter(
	void* targetFunc,
	void* callbackParam,
	size_t frameBase
) {
	printf(
		"+foo(func: %p, param: %p):\n",
		targetFunc,
		callbackParam
	);

#if (_AXL_CPU_AMD64)
#	if (_AXL_CPP_MSC)
	spy::RegArgBlock* regArgBlock = (spy::RegArgBlock*)(frameBase + spy::FrameOffset_RegArgBlock);

	int a    = (int)regArgBlock->m_rcx;
	double b = regArgBlock->m_xmm1[0];
	int c    = (int)regArgBlock->m_r8;
	double d = regArgBlock->m_xmm3[0];

	spy::VaList va;
	spy::vaStart(va, frameBase);

	int e = spy::vaArg<int>(va);
	double f = spy::vaArg<double>(va);
	int g = spy::vaArg<int>(va);
	double h = spy::vaArg<double>(va);
	int i = spy::vaArg<int>(va);
	double j = spy::vaArg<double>(va);
	int k = spy::vaArg<int>(va);
	double l = spy::vaArg<double>(va);
	int m = spy::vaArg<int>(va);
	double n = spy::vaArg<double>(va);
	int o = spy::vaArg<int>(va);
	double p = spy::vaArg<double>(va);
	int q = spy::vaArg<int>(va);
	double r = spy::vaArg<double>(va);

#	elif (_AXL_CPP_GCC)
	spy::RegArgBlock* regArgBlock = (spy::RegArgBlock*)(frameBase + spy::FrameOffset_RegArgBlock);

	int a = (int)regArgBlock->m_rdi;
	int c = (int)regArgBlock->m_rsi;
	int e = (int)regArgBlock->m_rdx;
	int g = (int)regArgBlock->m_rcx;
	int i = (int)regArgBlock->m_r8;
	int k = (int)regArgBlock->m_r9;
	double b = regArgBlock->m_xmm0[0];
	double d = regArgBlock->m_xmm1[0];
	double f = regArgBlock->m_xmm2[0];
	double h = regArgBlock->m_xmm3[0];
	double j = regArgBlock->m_xmm4[0];
	double l = regArgBlock->m_xmm5[0];
	double n = regArgBlock->m_xmm6[0];
	double p = regArgBlock->m_xmm7[0];

	spy::VaList va;
	spy::vaStart(va, frameBase);

	int m = spy::vaArg<int>(va);
	int o = spy::vaArg<int>(va);
	int q = spy::vaArg<int>(va);
	double r = spy::vaArg<double>(va);

#	endif
#elif (_AXL_CPU_X86)
	spy::VaList va;
	spy::vaStart(va, frameBase);

	int a = spy::vaArg<int>(va);
	double b = spy::vaArg<double>(va);
	int c = spy::vaArg<int>(va);
	double d = spy::vaArg<double>(va);
	int e = spy::vaArg<int>(va);
	double f = spy::vaArg<double>(va);
	int g = spy::vaArg<int>(va);
	double h = spy::vaArg<double>(va);
	int i = spy::vaArg<int>(va);
	double j = spy::vaArg<double>(va);
	int k = spy::vaArg<int>(va);
	double l = spy::vaArg<double>(va);
	int m = spy::vaArg<int>(va);
	double n = spy::vaArg<double>(va);
	int o = spy::vaArg<int>(va);
	double p = spy::vaArg<double>(va);
	int q = spy::vaArg<int>(va);
	double r = spy::vaArg<double>(va);

#endif

	printf(
		"  ("
		"%d, %f, %d, %f, %d, %f, "
		"%d, %f, %d, %f, %d, %f, "
		"%d, %f, %d, %f, %d, %f)\n",
		a, b, c, d, e, f,
		g, h, i, j, k, l,
		m, n, o, p, q, r
	);

	return spy::HookAction_Default;
}